

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O3

void outlet_pointer(_outlet *x,t_gpointer *gp)

{
  _outconnect *p_Var1;
  t_gpointer gpointer;
  anon_union_8_2_4cf7151e_for_gp_un local_28;
  undefined8 uStack_20;
  t_gstub *local_18;
  
  if (stackcount < 999) {
    local_18 = gp->gp_stub;
    local_28 = gp->gp_un;
    uStack_20 = *(undefined8 *)&gp->gp_valid;
    stackcount = stackcount + 1;
    for (p_Var1 = x->o_connections; p_Var1 != (_outconnect *)0x0; p_Var1 = p_Var1->oc_next) {
      pd_pointer(p_Var1->oc_to,(t_gpointer *)&local_28);
    }
  }
  else {
    stackcount = stackcount + 1;
    pd_error(x->o_owner,"stack overflow");
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_pointer(t_outlet *x, t_gpointer *gp)
{
    t_outconnect *oc;
    t_gpointer gpointer;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    {
        gpointer = *gp;
        for (oc = x->o_connections; oc; oc = oc->oc_next)
            pd_pointer(oc->oc_to, &gpointer);
    }
    --stackcount;
}